

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

double __thiscall
mp::
PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
::eval_2nd(PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
           *this,double x)

{
  const_reference pvVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  size_type in_stack_ffffffffffffffc8;
  array<double,_1UL> *in_stack_ffffffffffffffd0;
  array<double,_1UL> *this_00;
  
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ::GetConParams((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                  *)0x5342fe);
  pvVar1 = std::array<double,_1UL>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (array<double,_1UL> *)*pvVar1;
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ::GetConParams((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                  *)0x53431e);
  pvVar1 = std::array<double,_1UL>::operator[](this_00,in_stack_ffffffffffffffc8);
  dVar2 = (double)this_00 * (*pvVar1 - 1.0);
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ::GetConParams((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                  *)0x534360);
  pvVar1 = std::array<double,_1UL>::operator[](this_00,in_stack_ffffffffffffffc8);
  dVar3 = pow(in_XMM0_Qa,*pvVar1 - 2.0);
  return dVar2 * dVar3;
}

Assistant:

double eval_2nd(double x) const override {
    return GetConParams()[0] *
        (GetConParams()[0]-1.0) *
        std::pow(x, GetConParams()[0]-2.0);
  }